

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Fad<double> *val)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  allocator<char> local_41;
  string local_40;
  
  iVar1 = this->num_elts;
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector",&local_41);
    ::error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      Fad<double>::operator=((Fad<double> *)((long)&this->ptr_to_data->val_ + lVar3),val);
      iVar1 = this->num_elts;
      lVar3 = lVar3 + 0x20;
    }
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}